

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

void __thiscall backend::codegen::RegAllocator::perform_load_stores(RegAllocator *this)

{
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *puVar1;
  size_t *psVar2;
  OpCode OVar3;
  _Head_base<0UL,_arm::Inst_*,_false> _Var4;
  _func_int **pp_Var5;
  int iVar6;
  pointer puVar7;
  long *plVar8;
  long lVar9;
  iterator iVar10;
  undefined8 *puVar11;
  Inst *__tmp_1;
  _Optional_payload_base<unsigned_int> pre_alloc_transient;
  _Storage<std::pair<unsigned_int,_unsigned_int>,_true> in_RSI;
  char *function;
  OpCode *r_00;
  Inst *pIVar12;
  int i_00;
  ulong uVar13;
  int i;
  Reg r_01;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  Reg RVar16;
  ReplaceWriteAction r_02;
  ReplaceWriteAction RVar17;
  __hashtable *__h;
  Reg r;
  ostream local_181;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_180;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  Function local_128;
  _List_node_base *local_d0;
  _func_int **local_c8;
  undefined1 local_c0 [16];
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined1 local_98;
  _func_int **local_90;
  _func_int **local_88;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_80;
  _func_int **local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  undefined **local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  puVar7 = (this->f->inst).
           super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->f->inst).
      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar7) {
    local_180 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                 *)&this->inst_sink;
    local_50 = (_func_int **)&PTR_display_001ed8f0;
    local_58 = (_func_int **)&PTR_display_001ed8b0;
    local_60 = (_func_int **)&PTR_display_001ed930;
    local_c8 = (_func_int **)&PTR_display_001ed9b0;
    local_68 = (_func_int **)&PTR_display_001ed9f0;
    local_70 = (_func_int **)&PTR_display_001eda30;
    local_78 = (_func_int **)&PTR_display_001ed738;
    local_88 = (_func_int **)&PTR_display_001ed970;
    local_90 = (_func_int **)&PTR_display_001eda88;
    local_178 = &(this->wrote_to)._M_h;
    local_d0 = (_List_node_base *)&this->active_reg_map;
    local_80 = &(this->spilled_cross_block_reg)._M_h;
    puVar1 = &this->active;
    uVar13 = 0;
    do {
      _Var4._M_head_impl =
           puVar7[uVar13]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
           _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
      local_181 = (ostream)0x0;
      AixLog::operator<<(&local_181,(Severity *)in_RSI);
      local_c0._0_8_ = &PTR__Tag_001eaf88;
      local_c0._8_8_ = &local_a8;
      local_b0 = 0;
      local_a8 = 0;
      local_98 = 1;
      AixLog::operator<<((ostream *)local_c0,(Tag *)in_RSI);
      local_40 = std::chrono::_V2::system_clock::now();
      local_48 = &PTR__Timestamp_001eaf58;
      local_38 = 0;
      AixLog::operator<<((ostream *)&local_48,(Timestamp *)in_RSI);
      local_148 = &local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"perform_load_stores","")
      ;
      local_170 = &local_160;
      function = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
      ;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,"");
      local_128._vptr_Function = (_func_int **)&PTR__Function_001eafb8;
      local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
      local_128.file._M_dataplus._M_p = (pointer)&local_128.file.field_2;
      if (local_148 == &local_138) {
        local_128.name.field_2._8_8_ = local_138._8_8_;
      }
      else {
        local_128.name._M_dataplus._M_p = (pointer)local_148;
      }
      local_128.name.field_2._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
      local_128.name.field_2._M_local_buf[0] = local_138._M_local_buf[0];
      local_128.name._M_string_length = local_140;
      local_140 = 0;
      local_138._M_local_buf[0] = '\0';
      if (local_170 == &local_160) {
        local_128.file.field_2._8_8_ = local_160._8_8_;
      }
      else {
        local_128.file._M_dataplus._M_p = (pointer)local_170;
      }
      local_128.file.field_2._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
      local_128.file.field_2._M_local_buf[0] = local_160._M_local_buf[0];
      local_128.file._M_string_length = local_168;
      local_168 = 0;
      local_160._M_local_buf[0] = '\0';
      local_128.line = 0x39a;
      local_128.is_null_ = false;
      local_170 = &local_160;
      local_148 = &local_138;
      AixLog::operator<<((ostream *)&local_128,(Function *)function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog," ",1);
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      std::ostream::put(-0x80);
      plVar8 = (long *)std::ostream::flush();
      (*(code *)*((_Var4._M_head_impl)->super_Displayable)._vptr_Displayable)
                (_Var4._M_head_impl,plVar8);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      AixLog::Function::~Function(&local_128);
      if (local_170 != &local_160) {
        operator_delete(local_170,
                        CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) +
                        1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,
                        CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0]) +
                        1);
      }
      local_c0._0_8_ = &PTR__Tag_001eaf88;
      if ((undefined1 *)local_c0._8_8_ != &local_a8) {
        operator_delete((void *)local_c0._8_8_,CONCAT71(uStack_a7,local_a8) + 1);
      }
      this->cur_cond = (_Var4._M_head_impl)->cond;
      pp_Var5 = ((_Var4._M_head_impl)->super_Displayable)._vptr_Displayable;
      i_00 = (int)uVar13;
      if (pp_Var5 == local_50) {
        replace_read(this,(Reg *)((long)(_Var4._M_head_impl + 1) + 4),i_00,
                     (optional<unsigned_int>)0x0);
        goto LAB_00173e8d;
      }
      if (pp_Var5 == local_58) {
        replace_read(this,(Reg *)((long)(_Var4._M_head_impl + 1) + 4),i_00,
                     (optional<unsigned_int>)0x0);
        replace_read(this,(OpCode *)((long)(_Var4._M_head_impl + 1) + 8),i_00,
                     (optional<unsigned_int>)0x0);
        r_00 = (OpCode *)((long)(_Var4._M_head_impl + 1) + 0xc);
LAB_00173ec0:
        replace_read(this,r_00,i_00,(optional<unsigned_int>)0x0);
LAB_00173ecd:
        invalidate_read(this,i_00);
        pIVar12 = _Var4._M_head_impl + 1;
        local_128._vptr_Function = (_func_int **)local_178;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_178,pIVar12,&local_128);
        pre_alloc_transient._M_payload = (_Storage<unsigned_int,_true>)0x0;
        pre_alloc_transient._M_engaged = false;
        pre_alloc_transient._5_3_ = 0;
LAB_00173efe:
        RVar17 = pre_replace_write(this,(Reg *)pIVar12,i_00,
                                   (optional<unsigned_int>)pre_alloc_transient);
        in_RSI = RVar17._0_8_;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  (local_180,
                   (this->f->inst).
                   super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar13);
        replace_write(this,RVar17,i_00);
      }
      else {
        if (pp_Var5 == local_60) {
          OVar3 = (_Var4._M_head_impl)->op;
          if (OVar3 == Mvn) {
LAB_00173e8d:
            if (*(char *)&_Var4._M_head_impl[3].super_Displayable == '\0') {
              r_00 = (OpCode *)((long)(_Var4._M_head_impl + 2) + 8);
              goto LAB_00173ec0;
            }
            goto LAB_00173ecd;
          }
          if (OVar3 != MovT) {
            if (OVar3 != Mov) {
              replace_read(this,(Reg *)(_Var4._M_head_impl + 1),i_00,(optional<unsigned_int>)0x0);
              if (*(char *)&_Var4._M_head_impl[3].super_Displayable == '\0') {
                pIVar12 = (Inst *)((long)(_Var4._M_head_impl + 2) + 8);
                goto LAB_00173f98;
              }
              goto LAB_00173fa8;
            }
            goto LAB_00173e8d;
          }
          local_c0._0_4_ = *(undefined4 *)&_Var4._M_head_impl[1].super_Displayable;
          replace_read(this,(Reg *)(_Var4._M_head_impl + 1),i_00,(optional<unsigned_int>)0x0);
          invalidate_read(this,i_00);
          local_128._vptr_Function = (_func_int **)local_178;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_178,_Var4._M_head_impl + 1,&local_128);
          pre_alloc_transient =
               (_Optional_payload_base<unsigned_int>)
               ((ulong)*(uint *)&_Var4._M_head_impl[1].super_Displayable | 0x100000000);
          pIVar12 = (Inst *)local_c0;
          goto LAB_00173efe;
        }
        if (pp_Var5 == local_c8) {
          if (*(undefined1 *)((long)(_Var4._M_head_impl + 4) + 8) == B) {
            replace_read(this,(MemoryOperand *)((long)(_Var4._M_head_impl + 1) + 8),i_00);
          }
          if ((_Var4._M_head_impl)->op != LdR) {
            pIVar12 = _Var4._M_head_impl + 1;
LAB_00173f98:
            replace_read(this,(Reg *)pIVar12,i_00,(optional<unsigned_int>)0x0);
            goto LAB_00173fa8;
          }
          goto LAB_00173ecd;
        }
        if (pp_Var5 == local_68) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = &PTR__exception_001ec1f8;
          __cxa_throw(puVar11,&prelude::NotImplementedException::typeinfo,std::exception::~exception
                     );
        }
        if (pp_Var5 == local_70) {
LAB_00173fa8:
          invalidate_read(this,i_00);
          goto LAB_00173fb3;
        }
        if (pp_Var5 == local_78) {
          invalidate_read(this,i_00);
          std::
          vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
          ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                    (local_180,
                     (this->f->inst).
                     super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
          lVar9 = std::__cxx11::string::find((char *)(_Var4._M_head_impl + 1),0x1b8c75,0);
          if (((lVar9 == 0) &&
              (puVar7 = (this->inst_sink).
                        super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
              8 < (ulong)((long)puVar7 -
                         (long)(this->inst_sink).
                               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start))) &&
             (pIVar12 = puVar7[-2]._M_t.
                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl,
             (pIVar12->super_Displayable)._vptr_Displayable == local_c8)) {
            puVar7[-2]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
                 puVar7[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
            puVar7[-1]._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl = pIVar12;
          }
          in_RSI = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)0x0;
          lVar9 = std::__cxx11::string::find((char)(_Var4._M_head_impl + 1),0);
          if (lVar9 != 0) {
            this->bb_reset = true;
          }
        }
        else {
          if (pp_Var5 != local_88) {
            if ((pp_Var5 == local_90) &&
               (iVar6 = std::__cxx11::string::compare((char *)(_Var4._M_head_impl + 1)), iVar6 == 0)
               ) {
              iVar6 = std::any_cast<int>((any *)(_Var4._M_head_impl + 3));
              this->stack_offset = this->stack_offset + iVar6;
            }
            goto LAB_00173fa8;
          }
          if (((this->delayed_store).
               super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
               super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged !=
               false) &&
             (RVar17.kind = Spill,
             RVar17._0_8_ = (this->delayed_store).
                            super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>.
                            _M_payload.
                            super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>.
                            _M_payload, replace_write(this,RVar17,i_00),
             (this->delayed_store).
             super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
             super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true
             )) {
            (this->delayed_store).
            super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
            super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged = false;
          }
          invalidate_read(this,i_00);
          if ((_Var4._M_head_impl)->op == B) {
            if (this->bb_reset == true) {
              p_Var14 = (((_List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           *)&local_d0->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
              if (p_Var14 != local_d0) {
                do {
                  iVar10 = std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(local_80,(key_type_conflict *)(p_Var14 + 1));
                  if (iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur ==
                      (__node_type *)0x0) {
                    p_Var15 = p_Var14->_M_next;
                  }
                  else {
                    local_150 = (undefined1 *)((long)&p_Var14[1]._M_next + 4);
                    RVar16 = *(Reg *)((long)&p_Var14[1]._M_next + 4);
                    iVar10 = std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::find(local_178,(key_type_conflict *)(p_Var14 + 1));
                    force_free(this,RVar16,false,
                               iVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
                               (__node_type *)0x0);
                    std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::_M_erase(&puVar1->_M_h,local_150);
                    p_Var15 = p_Var14->_M_next;
                    psVar2 = &(this->active_reg_map).
                              super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl._M_node._M_size;
                    *psVar2 = *psVar2 - 1;
                    std::__detail::_List_node_base::_M_unhook();
                    operator_delete(p_Var14,0x18);
                  }
                  p_Var14 = p_Var15;
                } while (p_Var15 != local_d0);
              }
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::clear(local_178);
              this->bb_reset = false;
            }
          }
          else if ((_Var4._M_head_impl)->op == Bl) {
            this->is_leaf_func = false;
            RVar16 = *(Reg *)&_Var4._M_head_impl[3].super_Displayable;
            r_01 = 4;
            if ((int)RVar16 < 4) {
              r_01 = RVar16;
            }
            if ((int)RVar16 < 1) {
LAB_001741b1:
              do {
                force_free(this,r_01,true,true);
                r_01 = r_01 + 1;
              } while (r_01 != 4);
            }
            else {
              local_150 = (undefined1 *)CONCAT44(local_150._4_4_,RVar16);
              RVar16 = 0;
              do {
                local_128._vptr_Function =
                     (_func_int **)CONCAT44(local_128._vptr_Function._4_4_,RVar16);
                std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::_M_erase(&puVar1->_M_h,&local_128);
                RVar16 = RVar16 + 1;
              } while (r_01 != RVar16);
              if ((int)local_150 < 4) goto LAB_001741b1;
            }
            force_free(this,0xc,true,true);
            force_free(this,0xe,true,true);
            std::
            vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
            ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                      (local_180,
                       (this->f->inst).
                       super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar13);
            local_128._vptr_Function =
                 (_func_int **)((ulong)local_128._vptr_Function & 0xffffffff00000000);
            in_RSI = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)&local_128;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&puVar1->_M_h,in_RSI);
            local_128._vptr_Function._0_4_ = 1;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&puVar1->_M_h,in_RSI);
            local_128._vptr_Function._0_4_ = 2;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&puVar1->_M_h,in_RSI);
            local_128._vptr_Function._0_4_ = 3;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&puVar1->_M_h,in_RSI);
            local_128._vptr_Function._0_4_ = 0xc;
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&puVar1->_M_h,in_RSI);
            local_128._vptr_Function = (_func_int **)CONCAT44(local_128._vptr_Function._4_4_,0xe);
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&puVar1->_M_h);
            goto LAB_00173fcc;
          }
LAB_00173fb3:
          in_RSI = (_Storage<std::pair<unsigned_int,_unsigned_int>,_true>)
                   ((this->f->inst).
                    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar13);
          std::
          vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
          ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                    (local_180,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_RSI);
        }
      }
LAB_00173fcc:
      if ((this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true) {
        in_RSI = (this->delayed_store).
                 super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
                 super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_payload;
        r_02.kind = Spill;
        r_02._0_8_ = in_RSI;
        replace_write(this,r_02,i_00);
        if ((this->delayed_store).
            super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
            super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged == true)
        {
          (this->delayed_store).
          super__Optional_base<std::pair<unsigned_int,_unsigned_int>,_true,_true>._M_payload.
          super__Optional_payload_base<std::pair<unsigned_int,_unsigned_int>_>._M_engaged = false;
        }
      }
      uVar13 = uVar13 + 1;
      puVar7 = (this->f->inst).
               super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->f->inst).
                                    super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3))
    ;
  }
  return;
}

Assistant:

void RegAllocator::perform_load_stores() {
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    LOG(TRACE) << " " << std::endl << *inst_ << std::endl;
    cur_cond = inst_->cond;
    if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      replace_read(x->r1, i);
      replace_read(x->r2, i);
      replace_read(x->r3, i);
      invalidate_read(i);
      wrote_to.insert(x->rd);
      auto prw = pre_replace_write(x->rd, i);
      inst_sink.push_back(std::move(f.inst[i]));
      replace_write(prw, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::Mvn) {
        replace_read(x->r2, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(x->r1, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else if (x->op == arm::OpCode::MovT) {
        auto r = x->r1;
        replace_read(x->r1, i);
        invalidate_read(i);
        wrote_to.insert(x->r1);
        auto prw = pre_replace_write(r, i, x->r1);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        replace_read(x->r1, i);
        replace_read(x->r2, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) {
        replace_read(*mem, i);
      }
      if (x->op == arm::OpCode::LdR) {
        invalidate_read(i);
        wrote_to.insert(x->rd);
        auto prw = pre_replace_write(x->rd, i);
        inst_sink.push_back(std::move(f.inst[i]));
        replace_write(prw, i);
      } else {
        // StR
        replace_read(x->rd, i);
        invalidate_read(i);
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      throw prelude::NotImplementedException();
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      invalidate_read(i);
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      // push pop only use gpr
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      invalidate_read(i);

      inst_sink.push_back(std::move(f.inst[i]));
      if (x->label.find(".ld_pc") == 0 && inst_sink.size() >= 2 &&
          dynamic_cast<LoadStoreInst *>(&**(inst_sink.end() - 2))) {
        // HACK: If it's load_pc label, delay store once more
        std::swap(*(inst_sink.end() - 2), *(inst_sink.end() - 1));
      }
      if (x->label.find(".bb" == 0)) {
        bb_reset = true;
      }
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (delayed_store) {
        // TODO: check if this is right
        auto [r, rd] = delayed_store.value();
        replace_write({r, rd, ReplaceWriteKind::Spill}, i);
        delayed_store = {};
      }
      invalidate_read(i);
      if (x->op == arm::OpCode::Bl) {
        is_leaf_func = false;
        auto &label = x->l;
        int param_cnt = x->param_cnt;
        int reg_cnt = std::min(param_cnt, 4);
        for (int i = 0; i < reg_cnt; i++) active.erase(Reg(i));
        for (int i = reg_cnt; i < 4; i++) force_free(Reg(i));
        // R12 should be freed whatever condition
        force_free(Reg(12));
        force_free(Reg(REG_LR));
        inst_sink.push_back(std::move(f.inst[i]));
        active.erase(Reg(0));
        active.erase(Reg(1));
        active.erase(Reg(2));
        active.erase(Reg(3));
        active.erase(Reg(12));
        active.erase(Reg(REG_LR));
      } else if (x->op == arm::OpCode::B) {
        if (bb_reset) {
          auto it = active_reg_map.begin();

          while (it != active_reg_map.end()) {
            if (spilled_cross_block_reg.find(it->first) !=
                spilled_cross_block_reg.end()) {
              force_free(it->second, false,
                         wrote_to.find(it->first) != wrote_to.end());
              active.erase(it->second);
              it = active_reg_map.erase(it);
            } else {
              it++;
            }
          }
          wrote_to.clear();
          bb_reset = false;
        }
        inst_sink.push_back(std::move(f.inst[i]));
      } else {
        inst_sink.push_back(std::move(f.inst[i]));
      }
    } else if (auto x = dynamic_cast<CtrlInst *>(inst_)) {
      if (x->key == "offset_stack") {
        int offset = std::any_cast<int>(x->val);
        stack_offset += offset;
      }
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    } else {
      invalidate_read(i);
      inst_sink.push_back(std::move(f.inst[i]));
    }
    if (delayed_store) {
      // TODO: check if this is right
      auto [r, rd] = delayed_store.value();
      replace_write({r, rd, ReplaceWriteKind::Spill}, i);
      delayed_store = {};
    }
  }
}